

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void readtechniques(uint32 numtechniques,uint8 *base,uint8 **ptr,uint32 *len,
                   MOJOSHADER_effectTechnique **techniques,MOJOSHADER_effectObject *objects,
                   MOJOSHADER_malloc m,void *d)

{
  undefined4 *puVar1;
  uint *puVar2;
  uint8 *puVar3;
  uint uVar4;
  MOJOSHADER_effectTechnique *pMVar5;
  char *pcVar6;
  MOJOSHADER_effectPass *pMVar7;
  MOJOSHADER_effectState *pMVar8;
  uint32 valoffset;
  uint32 typeoffset;
  undefined4 uVar9;
  uint32 uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong local_78;
  
  if (numtechniques != 0) {
    pMVar5 = (MOJOSHADER_effectTechnique *)(*m)(numtechniques * 0x28,d);
    *techniques = pMVar5;
    uVar16 = 0;
    memset(pMVar5,0,(ulong)(numtechniques * 0x28));
    do {
      pMVar5 = *techniques + uVar16;
      uVar14 = *len;
      uVar11 = 0;
      uVar4 = 0;
      uVar10 = 0;
      uVar13 = 0;
      if (3 < uVar14) {
        puVar2 = (uint *)*ptr;
        uVar4 = *puVar2;
        *ptr = (uint8 *)(puVar2 + 1);
        *len = uVar14 - 4;
        if (uVar14 - 4 < 4) {
          uVar11 = 0;
        }
        else {
          uVar11 = puVar2[1];
          *ptr = (uint8 *)(puVar2 + 2);
          *len = uVar14 - 8;
          if (3 < uVar14 - 8) {
            uVar13 = puVar2[2];
            *ptr = (uint8 *)(puVar2 + 3);
            uVar10 = uVar14 - 0xc;
            goto LAB_001223a5;
          }
        }
        uVar10 = 0;
        uVar13 = 0;
      }
LAB_001223a5:
      *len = uVar10;
      uVar14 = *(uint *)(base + uVar4);
      if ((ulong)uVar14 == 0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = (char *)(*m)(uVar14,d);
        memcpy(pcVar6,base + (ulong)uVar4 + 4,(ulong)uVar14);
      }
      pMVar5->name = pcVar6;
      pMVar5->annotation_count = uVar11;
      readannotations(uVar11,base,ptr,len,&pMVar5->annotations,objects,m,d);
      pMVar5->pass_count = uVar13;
      if (uVar13 != 0) {
        pMVar7 = (MOJOSHADER_effectPass *)(*m)(uVar13 * 0x28,d);
        pMVar5->passes = pMVar7;
        memset(pMVar7,0,(ulong)(uVar13 * 0x28));
        uVar12 = 0;
        do {
          pMVar7 = pMVar5->passes + uVar12;
          uVar14 = *len;
          uVar10 = 0;
          if (uVar14 < 4) {
            uVar11 = 0;
            uVar4 = 0;
            local_78 = 0;
          }
          else {
            puVar2 = (uint *)*ptr;
            uVar4 = *puVar2;
            *ptr = (uint8 *)(puVar2 + 1);
            *len = uVar14 - 4;
            if (uVar14 - 4 < 4) {
              uVar11 = 0;
              local_78 = 0;
              uVar10 = 0;
            }
            else {
              uVar11 = puVar2[1];
              *ptr = (uint8 *)(puVar2 + 2);
              *len = uVar14 - 8;
              if (uVar14 - 8 < 4) {
                local_78 = 0;
              }
              else {
                local_78 = (ulong)puVar2[2];
                *ptr = (uint8 *)(puVar2 + 3);
                uVar10 = uVar14 - 0xc;
              }
            }
          }
          *len = uVar10;
          uVar14 = *(uint *)(base + uVar4);
          if ((ulong)uVar14 == 0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = (char *)(*m)(uVar14,d);
            memcpy(pcVar6,base + (ulong)uVar4 + 4,(ulong)uVar14);
          }
          pMVar7->name = pcVar6;
          pMVar7->annotation_count = uVar11;
          readannotations(uVar11,base,ptr,len,&pMVar7->annotations,objects,m,d);
          uVar14 = (uint)local_78;
          pMVar7->state_count = uVar14;
          if (uVar14 != 0) {
            pMVar8 = (MOJOSHADER_effectState *)(*m)(uVar14 * 0x48,d);
            pMVar7->states = pMVar8;
            memset(pMVar8,0,(ulong)(uVar14 * 0x48));
            lVar15 = 0;
            do {
              pMVar8 = pMVar7->states;
              uVar14 = *len;
              uVar10 = 0;
              if (uVar14 < 4) {
                typeoffset = 0;
                uVar9 = 0;
                valoffset = 0;
              }
              else {
                puVar3 = *ptr;
                uVar9 = *(undefined4 *)puVar3;
                *ptr = puVar3 + 4;
                if ((uVar14 & 0xfffffffc) == 4) {
LAB_0012265a:
                  typeoffset = 0;
                }
                else {
                  *ptr = puVar3 + 8;
                  *len = uVar14 - 8;
                  if (uVar14 - 8 < 4) goto LAB_0012265a;
                  typeoffset = *(uint32 *)(puVar3 + 8);
                  *ptr = puVar3 + 0xc;
                  *len = uVar14 - 0xc;
                  if (3 < uVar14 - 0xc) {
                    valoffset = *(uint32 *)(puVar3 + 0xc);
                    *ptr = puVar3 + 0x10;
                    uVar10 = uVar14 - 0x10;
                    goto LAB_0012265e;
                  }
                }
                valoffset = 0;
              }
LAB_0012265e:
              *len = uVar10;
              puVar1 = (undefined4 *)((long)&pMVar8->type + lVar15);
              *puVar1 = uVar9;
              readvalue(base,typeoffset,valoffset,(MOJOSHADER_effectValue *)(puVar1 + 2),objects,m,d
                       );
              lVar15 = lVar15 + 0x48;
            } while (local_78 * 0x48 != lVar15);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar13);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != numtechniques);
  }
  return;
}

Assistant:

static void readtechniques(const uint32 numtechniques,
                           const uint8 *base,
                           const uint8 **ptr,
                           uint32 *len,
                           MOJOSHADER_effectTechnique **techniques,
                           MOJOSHADER_effectObject *objects,
                           MOJOSHADER_malloc m,
                           void *d)
{
    int i;
    if (numtechniques == 0) return;

    const uint32 siz = sizeof (MOJOSHADER_effectTechnique) * numtechniques;
    *techniques = (MOJOSHADER_effectTechnique *) m(siz, d);
    memset(*techniques, '\0', siz);

    for (i = 0; i < numtechniques; i++)
    {
        MOJOSHADER_effectTechnique *technique = &(*techniques)[i];

        const uint32 nameoffset = readui32(ptr, len);
        const uint32 numannos = readui32(ptr, len);
        const uint32 numpasses = readui32(ptr, len);

        technique->name = readstring(base, nameoffset, m, d);

        technique->annotation_count = numannos;
        readannotations(numannos, base, ptr, len,
                        &technique->annotations, objects,
                        m, d);

        technique->pass_count = numpasses;
        readpasses(numpasses, base, ptr, len,
                   &technique->passes, objects,
                   m, d);
    } // for
}